

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

Am_Wrapper * get_owners_move_grow_command_proc(Am_Object *self)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object widget;
  Am_Object local_20;
  Am_Object inter;
  Am_Object command;
  Am_Object *self_local;
  
  Am_Object::Am_Object(&inter,(Am_Object_Data *)0x0);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)&local_20);
    bVar1 = Am_Object::Valid(&local_38);
    if (bVar1) {
      Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_38,0x195);
      Am_Object::operator=(&inter,&local_40);
      Am_Object::~Am_Object(&local_40);
      bVar1 = Am_Object::Valid(&inter);
      if (bVar1) {
        Am_Object::Am_Object(&local_48,&Am_Command);
        bVar1 = Am_Object::Is_Instance_Of(&inter,&local_48);
        Am_Object::~Am_Object(&local_48);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          Am_Object::operator=(&inter,(Am_Object_Data *)0x0);
        }
      }
    }
    Am_Object::~Am_Object(&local_38);
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&inter);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&inter);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(get_owners_move_grow_command)
{
  Am_Object command = nullptr;
  Am_Object inter = self.Get_Owner(); // owner will be interactor
  if (inter.Valid()) {
    Am_Object widget = inter.Get_Owner(); // widget the interactor is in
    if (widget.Valid()) {
      command = widget.Get_Object(Am_MOVE_GROW_COMMAND);
      if (command.Valid()) {
        if (!command.Is_Instance_Of(Am_Command))
          command = nullptr; // then command slot just contains a regular object
      }
    }
  }
  return command;
}